

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O2

void __thiscall
svg::Text::Text(Text *this,Point *origin,string *content,Fill *fill,Font *font,Stroke *stroke)

{
  double dVar1;
  
  Shape::Shape(&this->super_Shape,fill,stroke);
  (this->super_Shape).super_Serializeable._vptr_Serializeable = (_func_int **)&PTR__Text_0010dd28;
  dVar1 = origin->y;
  (this->origin).x = origin->x;
  (this->origin).y = dVar1;
  std::__cxx11::string::string((string *)&this->content,(string *)content);
  Font::Font(&this->font,font);
  return;
}

Assistant:

Text(Point const & origin, std::string const & content, Fill const & fill = Fill(),
             Font const & font = Font(), Stroke const & stroke = Stroke())
            : Shape(fill, stroke), origin(origin), content(content), font(font) { }